

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O0

void __thiscall LocaleTest_WFormat_Test::TestBody(LocaleTest_WFormat_Test *this)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  locale *this_00;
  AssertionResult gtest_ar_2;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
  as;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  locale loc;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
  *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  wchar_t (*in_stack_fffffffffffffe88) [10];
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  int line;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  locale *in_stack_fffffffffffffea8;
  locale *this_01;
  Type type;
  locale *in_stack_fffffffffffffeb8;
  unsigned_long_long in_stack_fffffffffffffec0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_2
  in_stack_fffffffffffffec8;
  wchar_t (*in_stack_fffffffffffffed0) [5];
  locale *in_stack_fffffffffffffed8;
  wstring local_110 [8];
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_f0;
  undefined4 local_dc;
  undefined4 local_ac;
  wstring local_a8 [32];
  AssertionResult local_88 [2];
  undefined4 local_64;
  locale local_60;
  wstring local_58 [32];
  AssertionResult local_38 [2];
  locale local_18;
  locale local_10 [2];
  
  std::locale::locale(&local_18);
  this_00 = (locale *)operator_new(0x18);
  this_00->_M_impl = (_Impl *)0x0;
  this_00[1]._M_impl = (_Impl *)0x0;
  this_00[2]._M_impl = (_Impl *)0x0;
  numpunct<wchar_t>::numpunct
            ((numpunct<wchar_t> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::locale::locale<numpunct<wchar_t>>
            (this_00,in_stack_fffffffffffffea8,
             (numpunct<wchar_t> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  std::locale::~locale(&local_18);
  this_01 = &local_60;
  std::locale::locale(this_01);
  type = (Type)((ulong)this_01 >> 0x20);
  local_64 = 0x12d687;
  fmt::v5::format<wchar_t[5],int>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int *)in_stack_fffffffffffffec8.values_);
  testing::internal::EqHelper<false>::Compare<wchar_t[10],std::__cxx11::wstring>
            (in_stack_fffffffffffffe98,
             (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::__cxx11::wstring::~wstring(local_58);
  std::locale::~locale(&local_60);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10b32f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x10b38c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b3e4);
  local_ac = 0x12d687;
  fmt::v5::format<wchar_t[5],int>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int *)in_stack_fffffffffffffec8.values_);
  testing::internal::EqHelper<false>::Compare<wchar_t[10],std::__cxx11::wstring>
            (in_stack_fffffffffffffe98,
             (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::__cxx11::wstring::~wstring(local_a8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_88);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe88 =
         (wchar_t (*) [10])testing::AssertionResult::failure_message((AssertionResult *)0x10b4f6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x10b553);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b5ab);
  local_dc = 0x12d687;
  fmt::v5::
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
                      *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (int *)in_stack_fffffffffffffe78);
  fmt::v5::wformat_args::
  wformat_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>&>
            ((wformat_args *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78);
  args.field_1.values_ = in_stack_fffffffffffffec8.values_;
  args.types_ = in_stack_fffffffffffffec0;
  fmt::v5::vformat<wchar_t[5],wchar_t>(in_stack_fffffffffffffeb8,(wchar_t (*) [5])this_00,args);
  testing::internal::EqHelper<false>::Compare<wchar_t[10],std::__cxx11::wstring>
            (in_stack_fffffffffffffe98,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  std::__cxx11::wstring::~wstring(local_110);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b6cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffea0),line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffe80));
    testing::Message::~Message((Message *)0x10b718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b767);
  std::locale::~locale(local_10);
  return;
}

Assistant:

TEST(LocaleTest, WFormat) {
  std::locale loc(std::locale(), new numpunct<wchar_t>());
  EXPECT_EQ(L"1,234,567", fmt::format(std::locale(), L"{:n}", 1234567));
  EXPECT_EQ(L"1~234~567", fmt::format(loc, L"{:n}", 1234567));
  fmt::format_arg_store<fmt::wformat_context, int> as{1234567};
  EXPECT_EQ(L"1~234~567", fmt::vformat(loc, L"{:n}", fmt::wformat_args(as)));
}